

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_fast_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int originalSize)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  undefined8 uVar4;
  ushort uVar5;
  U32 length;
  int iVar6;
  uint uVar7;
  ushort *puVar8;
  ushort *puVar9;
  byte *pbVar10;
  uint uVar11;
  LZ4_byte *pLVar12;
  ushort uVar13;
  byte *pbVar14;
  ulong uVar15;
  BYTE *d_1;
  byte *pbVar16;
  byte *pbVar17;
  byte *__src;
  BYTE *s;
  BYTE *d;
  byte *pbVar18;
  byte *pbVar19;
  ulong uVar20;
  BYTE *e;
  ulong uVar21;
  int local_50;
  byte *local_38;
  
  uVar20 = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (uVar20 == 0) {
    iVar6 = LZ4_decompress_fast(source,dest,originalSize);
  }
  else {
    if ((LZ4_streamDecode->internal_donotuse).prefixEnd == (LZ4_byte *)dest) {
      if ((uVar20 < 0xffff) && (LZ4_streamDecode->table[1] != 0)) {
        if (source == (char *)0x0) {
          source = (char *)0xffffffff;
        }
        else {
          pLVar12 = (LZ4_streamDecode->internal_donotuse).externalDict + LZ4_streamDecode->table[1];
          if ((LZ4_streamDecode->internal_donotuse).externalDict == (LZ4_byte *)0x0) {
            pLVar12 = (LZ4_byte *)0x0;
          }
          if (originalSize == 0) {
            source = (char *)(ulong)(-(uint)(*source != '\0') | 1);
          }
          else {
            __src = (byte *)(dest + -uVar20);
            pbVar1 = (byte *)(dest + originalSize);
            local_50 = (int)source;
            pbVar19 = (byte *)dest;
            if (0x3f < originalSize) {
LAB_00114d6e:
              do {
                bVar3 = (byte)*(ushort *)source;
                uVar11 = (uint)bVar3;
                uVar7 = (uint)(bVar3 >> 4);
                if (uVar7 == 0xf) {
                  uVar7 = 0;
                  puVar9 = (ushort *)((long)source + 0x10);
                  do {
                    puVar8 = puVar9;
                    uVar7 = uVar7 + *(byte *)((long)puVar8 + -0xf);
                    puVar9 = (ushort *)((long)puVar8 + 1);
                  } while (*(byte *)((long)puVar8 + -0xf) == 0xff);
                  uVar20 = (ulong)uVar7;
                  pbVar18 = pbVar19 + uVar20 + 0xf;
                  source = (char *)(puVar8 + -7);
                  iVar6 = 6;
                  if (pbVar18 <= dest + (long)originalSize + -8) {
                    do {
                      *(undefined8 *)pbVar19 = *(undefined8 *)source;
                      pbVar19 = pbVar19 + 8;
                      source = (char *)((long)source + 8);
                    } while (pbVar19 < pbVar18);
                    source = (char *)((long)puVar8 + 1 + uVar20);
                    iVar6 = 0;
                    pbVar19 = pbVar18;
                  }
                  if (iVar6 != 0) {
                    if (iVar6 == 6) {
                      uVar20 = uVar20 + 0xf;
                      goto LAB_00115144;
                    }
                    goto LAB_00114d2d;
                  }
                }
                else {
                  *(undefined8 *)pbVar19 = *(undefined8 *)((long)source + 1);
                  if (0x8f < bVar3) {
                    *(undefined8 *)(pbVar19 + 8) = *(undefined8 *)((long)source + 9);
                  }
                  source = (char *)((byte *)((long)source + 1) + uVar7);
                  pbVar19 = pbVar19 + uVar7;
                }
                pbVar18 = pbVar19;
                uVar13 = *(ushort *)source;
                uVar20 = (ulong)uVar13;
                source = (char *)((long)source + 2);
                pbVar16 = pbVar18 + -uVar20;
                uVar21 = (ulong)(bVar3 & 0xf);
                if (uVar21 == 0xf) {
                  uVar11 = 0;
                  do {
                    uVar5 = *(ushort *)source;
                    source = (char *)((long)source + 1);
                    uVar11 = uVar11 + (byte)uVar5;
                  } while ((byte)uVar5 == 0xff);
                  uVar15 = (ulong)uVar11 + 0x13;
                  if (pbVar1 + -0x40 <= pbVar18 + (ulong)uVar11 + 0x13) goto LAB_0011519f;
                }
                else {
                  uVar15 = uVar21 + 4;
                  if (pbVar1 + -0x40 <= pbVar18 + uVar21 + 4) goto LAB_0011519f;
                  if ((__src <= pbVar16) && (7 < uVar13)) {
                    *(undefined8 *)pbVar18 = *(undefined8 *)pbVar16;
                    *(undefined8 *)(pbVar18 + 8) = *(undefined8 *)(pbVar16 + 8);
                    *(undefined2 *)(pbVar18 + 0x10) = *(undefined2 *)(pbVar16 + 0x10);
                    pbVar19 = pbVar18 + uVar21 + 4;
                    goto LAB_00114d6e;
                  }
                }
                pbVar2 = pbVar18 + uVar15;
                pbVar19 = pbVar2;
                if (pbVar16 < __src) {
                  if (pbVar2 <= pbVar1 + -5) {
                    uVar21 = (long)__src - (long)pbVar16;
                    uVar20 = uVar15 - uVar21;
                    if (uVar15 < uVar21 || uVar20 == 0) {
                      memmove(pbVar18,pLVar12 + -uVar21,uVar15);
                    }
                    else {
                      memcpy(pbVar18,pLVar12 + -uVar21,uVar21);
                      pbVar19 = pbVar18 + uVar21;
                      if ((ulong)((long)pbVar19 - (long)__src) < uVar20) {
                        pbVar18 = __src;
                        if ((long)uVar21 < (long)uVar15) {
                          do {
                            *pbVar19 = *pbVar18;
                            pbVar19 = pbVar19 + 1;
                            pbVar18 = pbVar18 + 1;
                          } while (pbVar19 < pbVar2);
                        }
                      }
                      else {
                        memcpy(pbVar19,__src,uVar20);
                        pbVar19 = pbVar2;
                      }
                    }
                    goto LAB_00114d6e;
                  }
                  goto LAB_00115093;
                }
                if (uVar13 < 0x10) {
                  if (uVar20 == 4) {
                    iVar6 = *(int *)pbVar16;
                  }
                  else if (uVar13 == 2) {
                    iVar6 = CONCAT22(*(undefined2 *)pbVar16,*(undefined2 *)pbVar16);
                  }
                  else {
                    if (uVar13 != 1) {
                      if (uVar13 < 8) {
                        pbVar18[0] = 0;
                        pbVar18[1] = 0;
                        pbVar18[2] = 0;
                        pbVar18[3] = 0;
                        *pbVar18 = *pbVar16;
                        pbVar18[1] = pbVar16[1];
                        pbVar18[2] = pbVar16[2];
                        pbVar18[3] = pbVar16[3];
                        uVar11 = inc32table[uVar13];
                        *(undefined4 *)(pbVar18 + 4) = *(undefined4 *)(pbVar16 + uVar11);
                        pbVar16 = pbVar16 + ((ulong)uVar11 - (long)dec64table[uVar13]);
                      }
                      else {
                        *(undefined8 *)pbVar18 = *(undefined8 *)pbVar16;
                        pbVar16 = pbVar16 + 8;
                      }
                      pbVar18 = pbVar18 + 8;
                      do {
                        *(undefined8 *)pbVar18 = *(undefined8 *)pbVar16;
                        pbVar18 = pbVar18 + 8;
                        pbVar16 = pbVar16 + 8;
                      } while (pbVar18 < pbVar2);
                      goto LAB_00114d6e;
                    }
                    iVar6 = (uint)*pbVar16 * 0x1010101;
                  }
                  *(int *)pbVar18 = iVar6;
                  *(int *)(pbVar18 + 4) = iVar6;
                  if (8 < uVar15) {
                    pbVar18 = pbVar18 + 8;
                    do {
                      *(int *)pbVar18 = iVar6;
                      *(int *)(pbVar18 + 4) = iVar6;
                      pbVar18 = pbVar18 + 8;
                    } while (pbVar18 < pbVar2);
                  }
                  goto LAB_00114d6e;
                }
                do {
                  uVar4 = *(undefined8 *)(pbVar18 + -uVar20 + 8);
                  *(undefined8 *)pbVar18 = *(undefined8 *)(pbVar18 + -uVar20);
                  *(undefined8 *)(pbVar18 + 8) = uVar4;
                  uVar4 = *(undefined8 *)(pbVar18 + -uVar20 + 0x10 + 8);
                  *(undefined8 *)(pbVar18 + 0x10) = *(undefined8 *)(pbVar18 + -uVar20 + 0x10);
                  *(undefined8 *)(pbVar18 + 0x18) = uVar4;
                  pbVar18 = pbVar18 + 0x20;
                } while (pbVar18 < pbVar2);
              } while( true );
            }
LAB_00115293:
            do {
              bVar3 = (byte)*(ushort *)source;
              source = (char *)((long)source + 1);
              while( true ) {
                uVar11 = (uint)bVar3;
                uVar20 = (ulong)(bVar3 >> 4);
                if ((0x8f < uVar11) || (dest + (long)originalSize + -0x1a < pbVar19)) break;
                *(undefined8 *)pbVar19 = *(undefined8 *)source;
                pbVar18 = pbVar19 + uVar20;
                uVar15 = (ulong)(uVar11 & 0xf);
                puVar9 = (ushort *)((long)source + uVar20);
                uVar13 = *puVar9;
                pbVar16 = pbVar18 + -(ulong)uVar13;
                if ((((uVar11 & 0xf) == 0xf) || (uVar13 < 8)) || (pbVar16 < __src))
                goto LAB_0011517b;
                *(undefined8 *)pbVar18 = *(undefined8 *)pbVar16;
                *(undefined8 *)(pbVar18 + 8) = *(undefined8 *)(pbVar16 + 8);
                *(undefined2 *)(pbVar18 + 0x10) = *(undefined2 *)(pbVar16 + 0x10);
                pbVar19 = pbVar18 + uVar15 + 4;
                bVar3 = *(byte *)((long)source + uVar20 + 2);
                source = (char *)((long)source + uVar20 + 3);
              }
              if (bVar3 >> 4 == 0xf) {
                uVar7 = 0;
                do {
                  uVar13 = *(ushort *)source;
                  source = (char *)((long)source + 1);
                  uVar7 = uVar7 + (byte)uVar13;
                } while ((byte)uVar13 == 0xff);
                uVar20 = (ulong)uVar7 + 0xf;
              }
              pbVar18 = pbVar19 + uVar20;
LAB_00115144:
              puVar9 = (ushort *)source;
              if (dest + (long)originalSize + -8 < pbVar18) {
                if (pbVar18 != pbVar1) goto LAB_00115093;
                memmove(pbVar19,source,uVar20);
                source = (char *)(ulong)(uint)(((int)source + (int)uVar20) - local_50);
                goto LAB_00114d2d;
              }
              do {
                *(undefined8 *)pbVar19 = *(undefined8 *)puVar9;
                pbVar19 = pbVar19 + 8;
                puVar9 = puVar9 + 4;
              } while (pbVar19 < pbVar18);
              puVar9 = (ushort *)((long)source + uVar20);
              uVar13 = *puVar9;
              pbVar16 = pbVar18 + -(ulong)uVar13;
              uVar15 = (ulong)(uVar11 & 0xf);
LAB_0011517b:
              source = (char *)(puVar9 + 1);
              if ((int)uVar15 == 0xf) {
                uVar11 = 0;
                do {
                  uVar5 = *(ushort *)source;
                  source = (char *)((long)source + 1);
                  uVar11 = uVar11 + (byte)uVar5;
                } while ((byte)uVar5 == 0xff);
                uVar15 = (ulong)uVar11 + 0xf;
              }
              uVar15 = uVar15 + 4;
LAB_0011519f:
              pbVar2 = pbVar18 + uVar15;
              pbVar19 = pbVar2;
              if (pbVar16 < __src) {
                if (pbVar1 + -5 < pbVar2) goto LAB_00115093;
                uVar20 = (long)__src - (long)pbVar16;
                uVar21 = uVar15 - uVar20;
                if (uVar15 < uVar20 || uVar21 == 0) {
                  memmove(pbVar18,pLVar12 + -uVar20,uVar15);
                }
                else {
                  memcpy(pbVar18,pLVar12 + -uVar20,uVar20);
                  pbVar19 = pbVar18 + uVar20;
                  if ((ulong)((long)pbVar19 - (long)__src) < uVar21) {
                    pbVar18 = __src;
                    if ((long)uVar20 < (long)uVar15) {
                      do {
                        *pbVar19 = *pbVar18;
                        pbVar19 = pbVar19 + 1;
                        pbVar18 = pbVar18 + 1;
                      } while (pbVar19 < pbVar2);
                    }
                  }
                  else {
                    memcpy(pbVar19,__src,uVar21);
                    pbVar19 = pbVar2;
                  }
                }
                goto LAB_00115293;
              }
              if (uVar13 < 8) {
                LZ4_decompress_fast_continue_cold_1();
                pbVar16 = local_38;
              }
              else {
                *(undefined8 *)pbVar18 = *(undefined8 *)pbVar16;
                pbVar16 = pbVar16 + 8;
              }
              pbVar10 = pbVar18 + 8;
              if (pbVar2 <= pbVar1 + -0xc) {
                *(undefined8 *)pbVar10 = *(undefined8 *)pbVar16;
                if (0x10 < uVar15) {
                  pbVar18 = pbVar18 + 0x10;
                  do {
                    pbVar16 = pbVar16 + 8;
                    *(undefined8 *)pbVar18 = *(undefined8 *)pbVar16;
                    pbVar18 = pbVar18 + 8;
                  } while (pbVar18 < pbVar2);
                }
                goto LAB_00115293;
              }
              iVar6 = 5;
              if (pbVar2 <= pbVar1 + -5) {
                pbVar18 = pbVar1 + -7;
                pbVar14 = pbVar16;
                pbVar17 = pbVar10;
                if (pbVar10 < pbVar18) {
                  do {
                    *(undefined8 *)pbVar17 = *(undefined8 *)pbVar14;
                    pbVar17 = pbVar17 + 8;
                    pbVar14 = pbVar14 + 8;
                  } while (pbVar17 < pbVar18);
                  pbVar16 = pbVar16 + ((long)pbVar18 - (long)pbVar10);
                  pbVar10 = pbVar18;
                }
                iVar6 = 0;
                for (; pbVar10 < pbVar2; pbVar10 = pbVar10 + 1) {
                  bVar3 = *pbVar16;
                  pbVar16 = pbVar16 + 1;
                  *pbVar10 = bVar3;
                }
              }
            } while (iVar6 == 0);
            if (iVar6 == 5) {
LAB_00115093:
              source = (char *)(ulong)(~(uint)source + local_50);
            }
          }
        }
      }
      else {
        uVar11 = LZ4_decompress_fast(source,dest,originalSize);
        source = (char *)(ulong)uVar11;
      }
LAB_00114d2d:
      iVar6 = (int)source;
      if (iVar6 < 1) {
        return iVar6;
      }
      LZ4_streamDecode->table[3] = LZ4_streamDecode->table[3] + (long)originalSize;
      (LZ4_streamDecode->internal_donotuse).prefixEnd =
           (LZ4_streamDecode->internal_donotuse).prefixEnd + originalSize;
      return iVar6;
    }
    (LZ4_streamDecode->internal_donotuse).extDictSize = uVar20;
    pLVar12 = (LZ4_streamDecode->internal_donotuse).prefixEnd + -uVar20;
    (LZ4_streamDecode->internal_donotuse).externalDict = pLVar12;
    iVar6 = LZ4_decompress_fast_extDict(source,dest,originalSize,pLVar12,uVar20);
  }
  if (0 < iVar6) {
    LZ4_streamDecode->table[3] = (long)originalSize;
    (LZ4_streamDecode->internal_donotuse).prefixEnd = (LZ4_byte *)(dest + originalSize);
  }
  return iVar6;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_fast_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int originalSize)
{
    LZ4_streamDecode_t_internal* lz4sd = &LZ4_streamDecode->internal_donotuse;
    int result;
    assert(originalSize >= 0);

    if (lz4sd->prefixSize == 0) {
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_fast(source, dest, originalSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd = (BYTE*)dest + originalSize;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        if (lz4sd->prefixSize >= 64 KB - 1 || lz4sd->extDictSize == 0)
            result = LZ4_decompress_fast(source, dest, originalSize);
        else
            result = LZ4_decompress_fast_doubleDict(source, dest, originalSize,
                                                    lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)originalSize;
        lz4sd->prefixEnd  += originalSize;
    } else {
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_fast_extDict(source, dest, originalSize,
                                             lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)originalSize;
        lz4sd->prefixEnd  = (BYTE*)dest + originalSize;
    }

    return result;
}